

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

void duckdb::Bit::Finalize(bitstring_t *str)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  
  pcVar4 = (str->value).pointer.prefix;
  pcVar2 = pcVar4;
  if (0xc < (str->value).pointer.length) {
    pcVar2 = (str->value).pointer.ptr;
  }
  bVar1 = *pcVar2;
  if ((ulong)bVar1 != 0) {
    uVar3 = 0;
    do {
      pcVar2 = pcVar4;
      if (0xc < (str->value).pointer.length) {
        pcVar2 = (str->value).pointer.ptr;
      }
      pcVar2[(uVar3 >> 3) + 1] = pcVar2[(uVar3 >> 3) + 1] | '\x01' << (~(byte)uVar3 & 7);
      uVar3 = uVar3 + 1;
    } while (bVar1 != uVar3);
  }
  uVar3 = (ulong)(str->value).pointer.length;
  if (uVar3 < 0xd) {
    switchD_005700f1::default(pcVar4 + uVar3,0,0xc - uVar3);
    return;
  }
  *(undefined4 *)((long)&str->value + 4) = *(undefined4 *)(str->value).pointer.ptr;
  return;
}

Assistant:

void Bit::Finalize(bitstring_t &str) {
	// bit strings require all padding bits to be set to 1
	// this method sets all padding bits to 1
	auto padding = GetBitPadding(str);
	for (idx_t i = 0; i < idx_t(padding); i++) {
		Bit::SetBitInternal(str, i, 1);
	}
	str.Finalize();
	Bit::Verify(str);
}